

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O3

void copytypeinfo(rnntypeinfo *dst,rnntypeinfo *src,char *file)

{
  int iVar1;
  rnnvalue *prVar2;
  uint64_t uVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  rnnenum *prVar7;
  char *pcVar8;
  int iVar9;
  int iVar10;
  undefined4 uVar11;
  rnnvalue **__ptr;
  rnnvalue *prVar12;
  rnnbitfield **pprVar13;
  rnnbitfield *prVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  
  dst->name = src->name;
  dst->shr = src->shr;
  uVar3 = src->max;
  dst->min = src->min;
  dst->max = uVar3;
  dst->align = src->align;
  if (0 < src->valsnum) {
    iVar15 = dst->valsnum;
    lVar17 = 0;
    do {
      iVar1 = dst->valsmax;
      __ptr = dst->vals;
      if (iVar1 <= iVar15) {
        iVar15 = iVar1 * 2;
        if (iVar1 == 0) {
          iVar15 = 0x10;
        }
        dst->valsmax = iVar15;
        __ptr = (rnnvalue **)realloc(__ptr,(long)iVar15 << 3);
        dst->vals = __ptr;
        iVar15 = dst->valsnum;
      }
      prVar2 = src->vals[lVar17];
      prVar12 = (rnnvalue *)calloc(0x68,1);
      prVar12->name = prVar2->name;
      prVar12->valvalid = prVar2->valvalid;
      prVar12->value = prVar2->value;
      pcVar4 = (prVar2->varinfo).prefixstr;
      pcVar5 = (prVar2->varinfo).varsetstr;
      pcVar6 = (prVar2->varinfo).variantsstr;
      iVar10 = (prVar2->varinfo).dead;
      uVar11 = *(undefined4 *)&(prVar2->varinfo).field_0x1c;
      prVar7 = (prVar2->varinfo).prefenum;
      pcVar8 = (prVar2->varinfo).prefix;
      iVar1 = (prVar2->varinfo).varsetsnum;
      iVar9 = (prVar2->varinfo).varsetsmax;
      (prVar12->varinfo).varsets = (prVar2->varinfo).varsets;
      (prVar12->varinfo).varsetsnum = iVar1;
      (prVar12->varinfo).varsetsmax = iVar9;
      (prVar12->varinfo).prefenum = prVar7;
      (prVar12->varinfo).prefix = pcVar8;
      (prVar12->varinfo).variantsstr = pcVar6;
      (prVar12->varinfo).dead = iVar10;
      *(undefined4 *)&(prVar12->varinfo).field_0x1c = uVar11;
      (prVar12->varinfo).prefixstr = pcVar4;
      (prVar12->varinfo).varsetstr = pcVar5;
      prVar12->file = file;
      lVar16 = (long)iVar15;
      iVar15 = iVar15 + 1;
      dst->valsnum = iVar15;
      __ptr[lVar16] = prVar12;
      lVar17 = lVar17 + 1;
    } while (lVar17 < src->valsnum);
  }
  if (0 < src->bitfieldsnum) {
    iVar15 = dst->bitfieldsnum;
    lVar17 = 0;
    do {
      iVar1 = dst->bitfieldsmax;
      if (iVar1 <= iVar15) {
        iVar15 = iVar1 * 2;
        if (iVar1 == 0) {
          iVar15 = 0x10;
        }
        dst->bitfieldsmax = iVar15;
        pprVar13 = (rnnbitfield **)realloc(dst->bitfields,(long)iVar15 << 3);
        dst->bitfields = pprVar13;
      }
      prVar14 = copybitfield(src->bitfields[lVar17],file);
      iVar1 = dst->bitfieldsnum;
      iVar15 = iVar1 + 1;
      dst->bitfieldsnum = iVar15;
      dst->bitfields[iVar1] = prVar14;
      lVar17 = lVar17 + 1;
    } while (lVar17 < src->bitfieldsnum);
  }
  return;
}

Assistant:

static void copytypeinfo (struct rnntypeinfo *dst, struct rnntypeinfo *src, char *file) {
	int i;
	dst->name = src->name;
	dst->shr = src->shr;
	dst->min = src->min;
	dst->max = src->max;
	dst->align = src->align;
	for (i = 0; i < src->valsnum; i++)
		ADDARRAY(dst->vals, copyvalue(src->vals[i], file));
	for (i = 0; i < src->bitfieldsnum; i++)
		ADDARRAY(dst->bitfields, copybitfield(src->bitfields[i], file));
}